

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_BtFindBestMatch_selectMLS
                 (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iLimit,
                 size_t *offsetPtr)

{
  int iVar1;
  size_t sVar2;
  size_t *in_RCX;
  BYTE *in_RDX;
  BYTE *in_RSI;
  ZSTD_compressionParameters *in_RDI;
  undefined8 in_R8;
  U32 mls;
  ZSTD_matchState_t *in_stack_fffffffffffffff8;
  
  iVar1 = *(int *)(in_RSI + 0x10);
  mls = (U32)((ulong)in_R8 >> 0x20);
  if (iVar1 != 4) {
    if (iVar1 == 5) {
      sVar2 = ZSTD_BtFindBestMatch(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,in_RCX,mls);
      return sVar2;
    }
    if (iVar1 - 6U < 2) {
      sVar2 = ZSTD_BtFindBestMatch(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,in_RCX,mls);
      return sVar2;
    }
  }
  sVar2 = ZSTD_BtFindBestMatch(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX,in_RCX,mls);
  return sVar2;
}

Assistant:

static size_t ZSTD_BtFindBestMatch_selectMLS (
                        ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(cParams->searchLength)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_BtFindBestMatch(ms, cParams, ip, iLimit, offsetPtr, 4);
    case 5 : return ZSTD_BtFindBestMatch(ms, cParams, ip, iLimit, offsetPtr, 5);
    case 7 :
    case 6 : return ZSTD_BtFindBestMatch(ms, cParams, ip, iLimit, offsetPtr, 6);
    }
}